

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void mess_init(void)

{
  t_symbol *ptVar1;
  
  if (pd_objectmaker == (t_pd)0x0) {
    s_inter_newpdinstance();
    sys_lock();
    pd_globallock();
    pdinstance_init(&pd_maininstance);
    class_extern_dir = &s_;
    ptVar1 = gensym("objectmaker");
    pd_objectmaker = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
    ptVar1 = gensym("canvasmaker");
    pd_canvasmaker = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
    class_addanything(pd_objectmaker,new_anything);
    pd_globalunlock();
    sys_unlock();
  }
  return;
}

Assistant:

void mess_init(void)
{
    if (pd_objectmaker)
        return;
#ifdef PDINSTANCE
    pd_this = &pd_maininstance;
#endif
    s_inter_newpdinstance();
    sys_lock();
    pd_globallock();
    pdinstance_init(&pd_maininstance);
    class_extern_dir = &s_;
    pd_objectmaker = class_new(gensym("objectmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    pd_canvasmaker = class_new(gensym("canvasmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    class_addanything(pd_objectmaker, (t_method)new_anything);
    pd_globalunlock();
    sys_unlock();
}